

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall mocker::RenameASTDeclarations::operator()(RenameASTDeclarations *this,IfStmt *node)

{
  bool bVar1;
  shared_ptr<mocker::ast::ASTNode> local_48 [2];
  shared_ptr<mocker::ast::ASTNode> local_28;
  IfStmt *local_18;
  IfStmt *node_local;
  RenameASTDeclarations *this_local;
  
  local_18 = node;
  node_local = (IfStmt *)this;
  std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Statement,void>
            (&local_28,&node->then);
  visit(this,&local_28);
  std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_28);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_18->else_);
  if (bVar1) {
    std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Statement,void>
              (local_48,&local_18->else_);
    visit(this,local_48);
    std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(local_48);
  }
  return;
}

Assistant:

void operator()(ast::IfStmt &node) const override {
    visit(node.then);
    if (node.else_)
      visit(node.else_);
  }